

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall
mp::NLFeeder_Easy::FeedRowAndObjNames<mp::StringFileWriter>
          (NLFeeder_Easy *this,StringFileWriter *wrt)

{
  bool bVar1;
  int i;
  long lVar2;
  
  if ((this->nlme_).row_names_ != (char **)0x0) {
    bVar1 = StringFileWriter::operator_cast_to_bool(wrt);
    if (bVar1) {
      for (lVar2 = 0; lVar2 < (this->nlme_).num_row_; lVar2 = lVar2 + 1) {
        StringFileWriter::Write<char_const*>(wrt,(this->nlme_).row_names_[lVar2]);
      }
      StringFileWriter::Write<char_const*>(wrt,(this->nlme_).obj_name_);
      return;
    }
  }
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    if (NLME().RowNames() && wrt) {
      for (int i=0; i<NLME().NumRows(); ++i)
        wrt << NLME().RowNames()[i];
      wrt << NLME().ObjName();
    }
  }